

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O2

void __thiscall
hwnet::http::HttpResponse::HttpResponse
          (HttpResponse *this,shared_ptr<hwnet::http::HttpSession> *session,
          shared_ptr<hwnet::http::HttpPacket> *packet)

{
  (this->super_enable_shared_from_this<hwnet::http::HttpResponse>)._M_weak_this.
  super___weak_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<hwnet::http::HttpResponse>)._M_weak_this.
  super___weak_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->session).
              super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>,
             &session->super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>
             ,&packet->super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

HttpResponse(const std::shared_ptr<HttpSession> &session,const std::shared_ptr<HttpPacket> &packet):session(session),packet(packet) {

	}